

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Scene::visualizeShadowMap(Scene *this)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  long in_RDI;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> shader_bind;
  unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> vertex_array_bind;
  undefined8 in_stack_fffffffffffffe58;
  int fieldsPerAttribute;
  allocator *paVar1;
  string *in_stack_fffffffffffffe60;
  Shader *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string *paramName;
  Shader *this_00;
  GLResourceManager *in_stack_fffffffffffffe80;
  TextureArrayId textureArrayId;
  undefined8 in_stack_fffffffffffffe88;
  VertexArrayId vaid;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  undefined4 local_f8;
  undefined1 local_f1 [33];
  undefined4 local_d0;
  allocator local_c9;
  string local_c8 [32];
  undefined4 local_a8;
  allocator local_a1;
  string local_a0 [32];
  undefined4 local_80;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [48];
  string local_28 [40];
  
  fieldsPerAttribute = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  vaid.id = (GLuint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"pre viz shadow map",(allocator *)(local_58 + 0x2f));
  checkGLError((string *)0x1be9a6);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)(local_58 + 0x2f));
  local_58._12_4_ = *(undefined4 *)(in_RDI + 0x620);
  GLResourceManager::bindVertexArray(in_stack_fffffffffffffe80,vaid);
  Shader::bind((Shader *)local_58,(int)*(undefined8 *)(in_RDI + 0xe8),__addr,in_ECX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"vtx_position",&local_79);
  local_80 = *(undefined4 *)(in_RDI + 0x624);
  Shader::setVertexBuffer
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,fieldsPerAttribute,
             (VertexBufferId)(GLuint)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"vtx_texcoord",&local_a1);
  local_a8 = *(undefined4 *)(in_RDI + 0x628);
  Shader::setVertexBuffer
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,fieldsPerAttribute,
             (VertexBufferId)(GLuint)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  this_00 = *(Shader **)(in_RDI + 0xe8);
  paVar1 = &local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"depthTextureArray",paVar1);
  local_d0 = *(undefined4 *)(in_RDI + 0x618);
  textureArrayId.id = (GLuint)((ulong)paVar1 >> 0x20);
  Shader::setTextureArraySampler(this_00,in_stack_fffffffffffffe70,textureArrayId);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  paramName = (string *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f1 + 1),"colorTextureArray",(allocator *)paramName);
  local_f8 = *(undefined4 *)(in_RDI + 0x61c);
  Shader::setTextureArraySampler(this_00,paramName,textureArrayId);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  paVar1 = &local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"before glDrawArrays for shadow viz",paVar1);
  checkGLError((string *)0x1bec62);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  glDrawArrays(4,0,6);
  paVar1 = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"post viz shadow map",paVar1);
  checkGLError((string *)0x1becc0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr
            ((unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *)paramName);
  std::unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_>::~unique_ptr
            ((unique_ptr<CS248::Cleanup,_std::default_delete<CS248::Cleanup>_> *)paramName);
  return;
}

Assistant:

void Scene::visualizeShadowMap() {
    checkGLError("pre viz shadow map");

    auto vertex_array_bind = gl_mgr_->bindVertexArray(shadowVizVertexArrayId_);
    auto shader_bind = shadowVizShader_->bind();
    shadowVizShader_->setVertexBuffer("vtx_position", 3, shadowVizVtxBufferId_);
    shadowVizShader_->setVertexBuffer("vtx_texcoord", 2, shadowVizTexCoordBufferId_);
    shadowVizShader_->setTextureArraySampler("depthTextureArray", shadowDepthTextureArrayId_);
    shadowVizShader_->setTextureArraySampler("colorTextureArray", shadowColorTextureArrayId_);
    // now issue the draw command to OpenGL
    checkGLError("before glDrawArrays for shadow viz");
    // 6 indices, 2 triangles to render
    glDrawArrays(GL_TRIANGLES, /*first=*/0, /*count=*/6);

    checkGLError("post viz shadow map");
}